

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.hpp
# Opt level: O0

void __thiscall tcu::Sampler::Sampler(Sampler *this)

{
  Vector<float,_4> local_20;
  Sampler *local_10;
  Sampler *this_local;
  
  this->wrapS = WRAPMODE_LAST;
  this->wrapT = WRAPMODE_LAST;
  this->wrapR = WRAPMODE_LAST;
  this->minFilter = FILTERMODE_LAST;
  this->magFilter = FILTERMODE_LAST;
  this->lodThreshold = 0.0;
  this->normalizedCoords = true;
  this->compare = COMPAREMODE_NONE;
  this->compareChannel = 0;
  local_10 = this;
  Vector<float,_4>::Vector(&local_20,0.0,0.0,0.0,0.0);
  rr::GenericVec4::GenericVec4<float>(&this->borderColor,&local_20);
  this->seamlessCubeMap = false;
  this->depthStencilMode = MODE_DEPTH;
  return;
}

Assistant:

Sampler (void)
		: wrapS				(WRAPMODE_LAST)
		, wrapT				(WRAPMODE_LAST)
		, wrapR				(WRAPMODE_LAST)
		, minFilter			(FILTERMODE_LAST)
		, magFilter			(FILTERMODE_LAST)
		, lodThreshold		(0.0f)
		, normalizedCoords	(true)
		, compare			(COMPAREMODE_NONE)
		, compareChannel	(0)
		, borderColor		(Vec4(0.0f, 0.0f, 0.0f, 0.0f))
		, seamlessCubeMap	(false)
		, depthStencilMode	(MODE_DEPTH)
	{
	}